

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void NULLC::TraceLabel(char *str)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  uint *puVar5;
  TraceEvent *traceEvent;
  uint token;
  uint count;
  TraceContext *context;
  char *str_local;
  
  lVar2 = traceContext;
  sVar4 = strlen(str);
  uVar3 = (int)sVar4 + 1;
  if ((*(uint *)(lVar2 + 0x264) <= *(int *)(lVar2 + 0x260) + uVar3) ||
     (*(int *)(lVar2 + 0x270) == *(int *)(lVar2 + 0x274))) {
    TraceDump();
  }
  if (uVar3 < *(uint *)(lVar2 + 0x264)) {
    iVar1 = *(int *)(lVar2 + 0x260);
    memcpy((void *)(*(long *)(lVar2 + 0x268) + (ulong)*(uint *)(lVar2 + 0x260)),str,(ulong)uVar3);
    *(uint *)(lVar2 + 0x260) = uVar3 + *(int *)(lVar2 + 0x260);
    uVar3 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar3 + 1;
    puVar5 = (uint *)(*(long *)(lVar2 + 0x278) + (ulong)uVar3 * 8);
    *puVar5 = *puVar5 & 0xfffffffe;
    *puVar5 = *puVar5 & 0xfffffffd | 2;
    *puVar5 = *puVar5 & 3 | iVar1 << 2;
    puVar5[1] = 0;
    return;
  }
  __assert_fail("count < context.labels.max",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                ,0x127,"void NULLC::TraceLabel(const char *)");
}

Assistant:

inline void TraceLabel(const char *str)
	{
		TraceContext &context = *traceContext;

		unsigned count = unsigned(strlen(str)) + 1;

		if(context.labels.count + count >= context.labels.max || context.events.count == context.events.max)
			TraceDump();

		assert(count < context.labels.max);

		unsigned token = context.labels.count;

		memcpy(&context.labels.data[context.labels.count], str, count);
		context.labels.count += count;

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = true;
		traceEvent.token = token;
		traceEvent.ts = 0;
	}